

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O1

int SUNLinSolSetup(SUNLinearSolver S,SUNMatrix A)

{
  _func_int_SUNLinearSolver_SUNMatrix *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->setup;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver_SUNMatrix *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(S,A);
    return iVar1;
  }
  return 0;
}

Assistant:

int SUNLinSolSetup(SUNLinearSolver S, SUNMatrix A)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setup)
    ier = S->ops->setup(S, A);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}